

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O0

void __thiscall
CMU462::Vertex::getAxes
          (Vertex *this,vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *axes)

{
  reference pvVar1;
  pointer pHVar2;
  pointer pVVar3;
  reference pvVar4;
  Vector3D local_c8;
  double local_b0;
  Vector3D local_a8;
  Vector3D local_90;
  _List_const_iterator<CMU462::Halfedge> local_78;
  _List_const_iterator<CMU462::Halfedge> local_70;
  _List_const_iterator<CMU462::Vertex> local_68;
  undefined1 local_60 [8];
  Vector3D p1;
  Vector3D p0;
  double local_28;
  double local_20;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *axes_local;
  Vertex *this_local;
  
  std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::resize(axes,3);
  normal((Vector3D *)&p0.z,this);
  pvVar1 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[](axes,2);
  pvVar1->x = p0.z;
  pvVar1->y = local_28;
  pvVar1->z = local_20;
  Vector3D::Vector3D((Vector3D *)&p1.z,&this->position);
  local_78._M_node = (_List_node_base *)halfedge(this);
  pHVar2 = std::_List_const_iterator<CMU462::Halfedge>::operator->(&local_78);
  local_70._M_node = (_List_node_base *)Halfedge::twin(pHVar2);
  pHVar2 = std::_List_const_iterator<CMU462::Halfedge>::operator->(&local_70);
  local_68._M_node = (_List_node_base *)Halfedge::vertex(pHVar2);
  pVVar3 = std::_List_const_iterator<CMU462::Vertex>::operator->(&local_68);
  Vector3D::Vector3D((Vector3D *)local_60,&pVVar3->position);
  Vector3D::operator-(&local_90,(Vector3D *)local_60,(Vector3D *)&p1.z);
  pvVar1 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[](axes,0);
  pvVar1->x = local_90.x;
  pvVar1->y = local_90.y;
  pvVar1->z = local_90.z;
  pvVar1 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[](axes,0);
  pvVar4 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[](axes,2);
  local_b0 = dot(pvVar1,pvVar4);
  pvVar1 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[](axes,2);
  CMU462::operator*(&local_a8,&local_b0,pvVar1);
  pvVar1 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[](axes,0);
  Vector3D::operator-=(pvVar1,&local_a8);
  pvVar1 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[](axes,0);
  Vector3D::normalize(pvVar1);
  pvVar1 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[](axes,2);
  pvVar4 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[](axes,0);
  cross(&local_c8,pvVar1,pvVar4);
  pvVar1 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[](axes,1);
  pvVar1->x = local_c8.x;
  pvVar1->y = local_c8.y;
  pvVar1->z = local_c8.z;
  return;
}

Assistant:

void Vertex::getAxes( vector<Vector3D>& axes ) const
  {
    axes.resize(3);

    // Set the Z direction to the normal direction
    axes[2] = normal();

    // Use the first outgoing edge to pick an arbitrary X
    // direction, projecting out any component of the Z
    // direction chosen above
    Vector3D p0 = position;
    Vector3D p1 = halfedge()->twin()->vertex()->position;
    axes[0] = p1 - p0;
    axes[0] -= dot( axes[0], axes[2] ) * axes[2];
    axes[0].normalize();

    // For the third axis, just take the cross product of
    // the first two, being careful to pick the order of the
    // cross product to satisfy the right-hand rule (i.e.,
    // so in the end we get X x Y = Z).
    axes[1] = cross( axes[2], axes[0] );
  }